

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_binbuf.c
# Opt level: O0

void binbuf_gettext(_binbuf *x,char **bufp,int *lengthp)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  int local_434;
  int newlength;
  int indx;
  t_atom *ap;
  char string [1000];
  int local_34;
  int length;
  char *newbuf;
  char *buf;
  int *lengthp_local;
  char **bufp_local;
  _binbuf *x_local;
  
  newbuf = (char *)getbytes(0);
  local_34 = 0;
  _newlength = x->b_vec;
  local_434 = x->b_n;
  while (local_434 != 0) {
    if ((((_newlength->a_type == A_SEMI) || (_newlength->a_type == A_COMMA)) && (local_34 != 0)) &&
       (newbuf[local_34 + -1] == ' ')) {
      local_34 = local_34 + -1;
    }
    atom_string(_newlength,(char *)&ap,1000);
    sVar2 = strlen((char *)&ap);
    iVar1 = local_34 + (int)sVar2;
    pcVar3 = (char *)resizebytes(newbuf,(long)local_34,(long)(iVar1 + 1));
    if (pcVar3 == (char *)0x0) break;
    strcpy(pcVar3 + local_34,(char *)&ap);
    if (_newlength->a_type == A_SEMI) {
      pcVar3[iVar1] = '\n';
    }
    else {
      pcVar3[iVar1] = ' ';
    }
    _newlength = _newlength + 1;
    local_434 = local_434 + -1;
    local_34 = iVar1 + 1;
    newbuf = pcVar3;
  }
  if (((local_34 != 0) && (newbuf[local_34 + -1] == ' ')) &&
     (pcVar3 = (char *)resizebytes(newbuf,(long)local_34,(long)(local_34 + -1)),
     pcVar3 != (char *)0x0)) {
    local_34 = local_34 + -1;
    newbuf = pcVar3;
  }
  *bufp = newbuf;
  *lengthp = local_34;
  return;
}

Assistant:

void binbuf_gettext(const t_binbuf *x, char **bufp, int *lengthp)
{
    char *buf = getbytes(0), *newbuf;
    int length = 0;
    char string[MAXPDSTRING];
    const t_atom *ap;
    int indx;

    for (ap = x->b_vec, indx = x->b_n; indx--; ap++)
    {
        int newlength;
        if ((ap->a_type == A_SEMI || ap->a_type == A_COMMA) &&
                length && buf[length-1] == ' ') length--;
        atom_string(ap, string, MAXPDSTRING);
        newlength = length + (int)strlen(string) + 1;
        if (!(newbuf = resizebytes(buf, length, newlength))) break;
        buf = newbuf;
        strcpy(buf + length, string);
        length = newlength;
        if (ap->a_type == A_SEMI) buf[length-1] = '\n';
        else buf[length-1] = ' ';
    }
    if (length && buf[length-1] == ' ')
    {
        if ((newbuf = t_resizebytes(buf, length, length-1)))
        {
            buf = newbuf;
            length--;
        }
    }
    *bufp = buf;
    *lengthp = length;
}